

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::SetMessageVariables
          (ImmutableMapFieldGenerator *this,FieldGeneratorInfo *info)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  AlphaNum *pAVar1;
  Context *pCVar2;
  pointer pcVar3;
  bool bVar4;
  JavaType JVar5;
  ClassNameResolver *pCVar6;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  FieldDescriptor *pFVar9;
  long *plVar10;
  MessageLite *pMVar11;
  EnumDescriptor *pEVar12;
  slot_type *psVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar14;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  char *pcVar15;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  Descriptor *descriptor;
  basic_string_view<char,_std::char_traits<char>_> *key;
  char *pcVar16;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar17;
  undefined1 in_R8B;
  undefined1 uVar18;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_1;
  anon_union_8_1_a8a14541_for_iterator_2 *name_resolver;
  Options *in_R9;
  Options *pOVar19;
  AlphaNum *d;
  string pass_through_nullness;
  string boxed_key_type;
  anon_union_8_1_a8a14541_for_iterator_2 local_318;
  anon_union_8_1_a8a14541_for_iterator_2 local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [32];
  FieldDescriptor *local_2d8;
  ClassNameResolver *local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [32];
  anon_union_8_1_a8a14541_for_iterator_2 local_298;
  AlphaNum *local_290;
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [8];
  undefined1 local_240 [44];
  JavaType local_214;
  anon_union_8_1_a8a14541_for_iterator_2 local_210;
  undefined1 local_208 [32];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  string local_1a8;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_188;
  anon_union_8_1_a8a14541_for_iterator_2 local_170;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_168 [2];
  undefined1 local_158 [16];
  HeapOrSoo local_148;
  long local_138 [2];
  undefined2 local_128;
  anon_union_8_1_a8a14541_for_iterator_2 local_120;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_118 [2];
  undefined1 local_108 [16];
  HeapOrSoo local_f8;
  long local_e8 [2];
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  variables = &this->variables_;
  SetCommonFieldVariables(this->descriptor_,info,variables);
  pCVar6 = Context::GetNameResolver(this->context_);
  pDVar7 = FieldDescriptor::message_type(this->descriptor_);
  local_2d0 = pCVar6;
  ClassNameResolver::GetClassName_abi_cxx11_((string *)&local_318,pCVar6,pDVar7,true);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [5])0x6e6c7a);
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,local_308._0_8_ + 1);
  }
  pFVar8 = MapKeyField(this->descriptor_);
  pFVar9 = MapValueField(this->descriptor_);
  local_208._28_4_ = GetJavaType(pFVar8);
  local_2d8 = pFVar9;
  JVar5 = GetJavaType(pFVar9);
  bVar4 = (this->context_->options_).opensource_runtime;
  pcVar16 = "@com.google.protobuf.Internal.ProtoPassThroughNullness ";
  if (bVar4 != false) {
    pcVar16 = "/* nullable */\n";
  }
  local_1c8._M_allocated_capacity = (size_type)local_1b8;
  pcVar15 = pcVar16 + 0x37;
  if (bVar4 != false) {
    pcVar15 = pcVar16 + 0xf;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar16,pcVar15);
  java::(anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)&local_318,(_anonymous_namespace_ *)pFVar8,(FieldDescriptor *)local_2d0,
             (ClassNameResolver *)0x0,(bool)in_R8B);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [9])0x634516);
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,local_308._0_8_ + 1);
  }
  java::(anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)(local_1b8 + 0x10),(_anonymous_namespace_ *)pFVar8,
             (FieldDescriptor *)local_2d0,(ClassNameResolver *)0x1,(bool)in_R8B);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[15]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_318,variables,(char (*) [15])"boxed_key_type");
  std::__cxx11::string::_M_assign((string *)((long)local_310.slot_ + 0x10));
  std::__cxx11::string::rfind((char)(local_1b8 + 0x10),0x2e);
  std::__cxx11::string::substr((ulong)&local_318,(ulong)(local_1b8 + 0x10));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[15]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [15])"short_key_type");
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  pFVar9 = extraout_RDX;
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,local_308._0_8_ + 1);
    pFVar9 = extraout_RDX_00;
  }
  java::(anonymous_namespace)::WireType_abi_cxx11_
            ((string *)&local_318,(_anonymous_namespace_ *)pFVar8,pFVar9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [14])"key_wire_type");
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,local_308._0_8_ + 1);
  }
  pCVar2 = this->context_;
  local_80[4] = (pCVar2->options_).opensource_runtime;
  local_80[5] = (pCVar2->options_).annotate_code;
  local_80[0] = (pCVar2->options_).generate_immutable_code;
  local_80[1] = (pCVar2->options_).generate_mutable_code;
  local_80[2] = (pCVar2->options_).generate_shared_code;
  local_80[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_214 = JVar5;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar2->options_).jvm_dsl;
  DefaultValue_abi_cxx11_
            ((string *)&local_318,(java *)pFVar8,(FieldDescriptor *)0x1,SUB81(local_2d0,0),
             (ClassNameResolver *)local_80,in_R9);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[18]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [18])"key_default_value");
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,local_308._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  JVar5 = local_214;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  bVar4 = IsReferenceType(local_208._28_4_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[15]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_318,variables,(char (*) [15])"key_null_check");
  pcVar16 = "if (key == null) { throw new NullPointerException(\"map key\"); }";
  if (!bVar4) {
    pcVar16 = "";
  }
  std::__cxx11::string::_M_replace
            ((long)local_310.slot_ + 0x10,0,*(char **)((long)local_310.slot_ + 0x18),(ulong)pcVar16)
  ;
  if (JVar5 == JAVATYPE_ENUM) {
    bVar4 = false;
  }
  else {
    bVar4 = IsReferenceType(JVar5);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_318,variables,(char (*) [17])"value_null_check");
  pcVar16 = "if (value == null) { throw new NullPointerException(\"map value\"); }";
  if (bVar4 == false) {
    pcVar16 = "";
  }
  uVar18 = 0x43;
  if (bVar4 == false) {
    uVar18 = 0;
  }
  std::__cxx11::string::_M_replace
            ((long)local_310.slot_ + 0x10,0,*(char **)((long)local_310.slot_ + 0x18),(ulong)pcVar16)
  ;
  if (JVar5 == JAVATYPE_ENUM) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_318,variables,(char (*) [11])0x63460b);
    std::__cxx11::string::_M_replace
              ((long)local_310.slot_ + 0x10,0,*(char **)((long)local_310.slot_ + 0x18),0x71c247);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [11])0x63460b);
    local_318 = (anon_union_8_1_a8a14541_for_iterator_2)0x20;
    local_310.slot_ = (slot_type *)0x6345e4;
    local_308._0_8_ =
         (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,*(long *)((long)local_290 + 0x10),
               *(long *)((long)local_290 + 0x18) + *(long *)((long)local_290 + 0x10));
    pOVar19 = (Options *)local_240;
    local_2c8._0_8_ = variables;
    local_248 = (undefined1  [8])&local_318;
    local_240._0_8_ = (slot_type *)local_308;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,local_2c8,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_318,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_248,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)pOVar19);
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_308._0_8_ !=
        (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2f8) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[17]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_318,variables,(char (*) [17])"boxed_value_type");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_310.slot_ + 0x10),0,*(char **)((long)local_310.slot_ + 0x18),
               0x54fb14);
    java::(anonymous_namespace)::WireType_abi_cxx11_
              ((string *)&local_318,(_anonymous_namespace_ *)local_2d8,field);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [16])"value_wire_type");
    std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
    }
    pCVar2 = this->context_;
    local_d0[4] = (pCVar2->options_).opensource_runtime;
    local_d0[5] = (pCVar2->options_).annotate_code;
    local_d0[0] = (pCVar2->options_).generate_immutable_code;
    local_d0[1] = (pCVar2->options_).generate_mutable_code;
    local_d0[2] = (pCVar2->options_).generate_shared_code;
    local_d0[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_c8._M_p = (pointer)&local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_88._1_1_ = (pCVar2->options_).jvm_dsl;
    pCVar6 = (ClassNameResolver *)local_d0;
    DefaultValue_abi_cxx11_
              ((string *)&local_298,(java *)local_2d8,(FieldDescriptor *)0x1,SUB81(local_2d0,0),
               pCVar6,pOVar19);
    uVar18 = SUB81(pCVar6,0);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_318.slot_ = (slot_type *)local_308;
    psVar13 = (slot_type *)(plVar10 + 2);
    if ((slot_type *)*plVar10 == psVar13) {
      local_308._0_8_ = (psVar13->value).first._M_len;
      local_308._8_8_ = plVar10[3];
    }
    else {
      local_308._0_8_ = (psVar13->value).first._M_len;
      local_318.slot_ = (slot_type *)*plVar10;
    }
    local_310 = (anon_union_8_1_a8a14541_for_iterator_2)plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[20]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_248,variables,(char (*) [20])"value_default_value");
    std::__cxx11::string::operator=((string *)(local_240._0_8_ + 0x10),(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,local_308._0_8_ + 1);
    }
    if (local_298.slot_ != (slot_type *)local_288) {
      operator_delete(local_298.slot_,local_288._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    java::(anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)&local_318,(_anonymous_namespace_ *)local_2d8,(FieldDescriptor *)local_2d0,
               (ClassNameResolver *)0x0,(bool)uVar18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [16])"value_enum_type");
    std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,local_308._0_8_ + 1);
    }
    local_298 = (anon_union_8_1_a8a14541_for_iterator_2)local_1c8._8_8_;
    local_290 = (AlphaNum *)local_1c8._M_allocated_capacity;
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_268,variables,(char (*) [16])"value_enum_type");
    local_240._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)(local_268._8_8_ + 0x10))->slot_;
    local_248 = *(undefined1 (*) [8])(local_268._8_8_ + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2c8,(lts_20250127 *)&local_298,(AlphaNum *)local_248,
               (AlphaNum *)local_240._0_8_);
    local_318 = (anon_union_8_1_a8a14541_for_iterator_2)0x25;
    local_310.slot_ = (slot_type *)0x634657;
    pfVar17 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2c8 + 0x10);
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2c8._0_8_ == pfVar17) {
      local_2f8._8_8_ = local_2b8._8_8_;
      local_308._0_8_ =
           (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_2f8;
    }
    else {
      local_308._0_8_ = local_2c8._0_8_;
    }
    local_2f8._1_7_ = local_2b8._1_7_;
    local_2f8[0] = local_2b8[0];
    local_308._8_8_ = local_2c8._8_8_;
    local_2c8._8_8_ = (slot_type *)0x0;
    local_2b8[0] = '\0';
    pOVar19 = (Options *)local_208;
    local_2c8._0_8_ = pfVar17;
    local_210.slot_ = (slot_type *)&local_318;
    local_208._0_8_ = (slot_type *)local_308;
    local_1e8._0_8_ = variables;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_268,local_1e8,(basic_string_view<char,_std::char_traits<char>_> *)&local_318
               ,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_210,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)pOVar19);
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_308._0_8_ !=
        (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2f8) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
    }
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2c8._0_8_ != pfVar17) {
      operator_delete((void *)local_2c8._0_8_,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
    }
    pMVar11 = protobuf::internal::ExtensionSet::GetMessage
                        (&(local_2d8->merged_features_->field_0)._impl_._extensions_,pb::java,
                         (MessageLite *)PTR__JavaFeatures_default_instance__00855a30);
    if ((*(char *)((long)&pMVar11[1]._internal_metadata_.ptr_ + 4) == '\0') &&
       (pEVar12 = FieldDescriptor::enum_type(local_2d8), pEVar12 != (EnumDescriptor *)0x0)) {
      pEVar12 = FieldDescriptor::enum_type(local_2d8);
      bVar4 = EnumDescriptor::is_closed(pEVar12);
      if (!bVar4) {
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::try_emplace_impl<char_const(&)[16]>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                    *)local_248,variables,(char (*) [16])"value_enum_type");
        local_290 = *(AlphaNum **)(local_240._0_8_ + 0x10);
        local_298 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_240._0_8_ + 0x18);
        local_248 = (undefined1  [8])&DAT_0000000d;
        local_240._0_8_ = ".UNRECOGNIZED";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_2c8,(lts_20250127 *)&local_298,(AlphaNum *)local_248,local_290);
        local_318 = (anon_union_8_1_a8a14541_for_iterator_2)0x12;
        local_310.slot_ = (slot_type *)0x63467d;
        if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_2c8._0_8_ == pfVar17) {
          local_2f8._8_8_ = local_2b8._8_8_;
          local_308._0_8_ =
               (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2f8;
        }
        else {
          local_308._0_8_ = local_2c8._0_8_;
        }
        local_2f8._1_7_ = local_2b8._1_7_;
        local_2f8[0] = local_2b8[0];
        local_308._8_8_ = local_2c8._8_8_;
        local_2c8._8_8_ = (slot_type *)0x0;
        local_2b8[0] = '\0';
        name_resolver = &local_210;
        local_2c8._0_8_ = pfVar17;
        local_210.slot_ = (slot_type *)&local_318;
        local_208._0_8_ = (slot_type *)local_308;
        local_1e8._0_8_ = variables;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                    *)local_268,local_1e8,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_318,
                   (piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)name_resolver,
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                    *)local_208);
        if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_308._0_8_ !=
            (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_2f8) {
          operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
        }
        if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_2c8._0_8_ == pfVar17) goto LAB_00321f71;
        local_158._0_8_ = CONCAT71(local_2b8._1_7_,local_2b8[0]);
        pfVar17 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_2c8._0_8_;
        goto LAB_00321f69;
      }
    }
    pCVar2 = this->context_;
    local_120._4_1_ = (pCVar2->options_).opensource_runtime;
    local_120._5_1_ = (pCVar2->options_).annotate_code;
    local_120._0_1_ = (pCVar2->options_).generate_immutable_code;
    local_120._1_1_ = (pCVar2->options_).generate_mutable_code;
    local_120._2_1_ = (pCVar2->options_).generate_shared_code;
    local_120._3_1_ = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_118[0] = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_f8.heap.control = (ctrl_t *)local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_108 + 0x10),pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
    name_resolver = &local_120;
    DefaultValue_abi_cxx11_
              ((string *)&local_318,(java *)local_2d8,(FieldDescriptor *)0x1,SUB81(local_2d0,0),
               (ClassNameResolver *)name_resolver,pOVar19);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [19])"unrecognized_value");
    std::__cxx11::string::operator=((string *)local_290->digits_,(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
    }
    if (local_f8.heap.control != (ctrl_t *)local_e8) {
      operator_delete(local_f8.heap.control,local_e8[0] + 1);
    }
    local_158._0_8_ = local_108._0_8_;
    pfVar17 = local_118[0];
    if (local_118[0] ==
        (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_108) goto LAB_00321f71;
  }
  else {
    java::(anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)&local_318,(_anonymous_namespace_ *)local_2d8,(FieldDescriptor *)local_2d0,
               (ClassNameResolver *)0x0,(bool)uVar18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [11])0x63460b);
    std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,local_308._0_8_ + 1);
    }
    bVar4 = IsReferenceType(JVar5);
    pAVar1 = (AlphaNum *)(local_268 + 0x10);
    local_268._0_8_ = pAVar1;
    if (bVar4) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_268,local_1c8._M_allocated_capacity,
                 (undefined1 *)(local_1c8._8_8_ + local_1c8._M_allocated_capacity));
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"");
    }
    local_298 = (anon_union_8_1_a8a14541_for_iterator_2)local_268._8_8_;
    local_290 = (AlphaNum *)local_268._0_8_;
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_210,variables,(char (*) [11])0x63460b);
    local_240._0_8_ = ((anon_union_8_1_a8a14541_for_iterator_2 *)(local_208._0_8_ + 0x10))->slot_;
    local_248 = *(undefined1 (*) [8])(local_208._0_8_ + 0x18);
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_2c8,(lts_20250127 *)&local_298,(AlphaNum *)local_248,
               (AlphaNum *)local_240._0_8_);
    local_318 = (anon_union_8_1_a8a14541_for_iterator_2)0x20;
    local_310.slot_ = (slot_type *)0x6345e4;
    pfVar17 = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_2c8 + 0x10);
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2c8._0_8_ == pfVar17) {
      local_2f8._8_8_ = local_2b8._8_8_;
      local_308._0_8_ =
           (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_2f8;
    }
    else {
      local_308._0_8_ = local_2c8._0_8_;
    }
    local_2f8._1_7_ = local_2b8._1_7_;
    local_2f8[0] = local_2b8[0];
    local_308._8_8_ = local_2c8._8_8_;
    local_2c8._8_8_ = (slot_type *)0x0;
    local_2b8[0] = '\0';
    pOVar19 = (Options *)(local_1e8 + 8);
    local_1e8._8_8_ = local_308;
    args_1 = (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_1e8;
    local_2c8._0_8_ = pfVar17;
    local_1e8._0_8_ = &local_318;
    local_188.first.ctrl_ = (ctrl_t *)variables;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_210,&local_188,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_318,
               (piecewise_construct_t *)&std::piecewise_construct,args_1,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                *)pOVar19);
    uVar18 = SUB81(args_1,0);
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_308._0_8_ !=
        (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2f8) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
    }
    if ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_2c8._0_8_ != pfVar17) {
      operator_delete((void *)local_2c8._0_8_,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
    }
    if ((AlphaNum *)local_268._0_8_ != pAVar1) {
      operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
    }
    java::(anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)&local_318,(_anonymous_namespace_ *)local_2d8,(FieldDescriptor *)local_2d0,
               (ClassNameResolver *)0x1,(bool)uVar18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[17]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [17])"boxed_value_type");
    std::__cxx11::string::operator=((string *)local_290->digits_,(string *)&local_318);
    pFVar8 = extraout_RDX_01;
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
      pFVar8 = extraout_RDX_02;
    }
    java::(anonymous_namespace)::WireType_abi_cxx11_
              ((string *)&local_318,(_anonymous_namespace_ *)local_2d8,pFVar8);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [16])"value_wire_type");
    std::__cxx11::string::operator=((string *)local_290->digits_,(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
    }
    pCVar2 = this->context_;
    local_170._4_1_ = (pCVar2->options_).opensource_runtime;
    local_170._5_1_ = (pCVar2->options_).annotate_code;
    local_170._0_1_ = (pCVar2->options_).generate_immutable_code;
    local_170._1_1_ = (pCVar2->options_).generate_mutable_code;
    local_170._2_1_ = (pCVar2->options_).generate_shared_code;
    local_170._3_1_ = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_168[0] = (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_148.heap.control = (ctrl_t *)local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_158 + 0x10),pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_128._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_128._1_1_ = (pCVar2->options_).jvm_dsl;
    name_resolver = &local_170;
    DefaultValue_abi_cxx11_
              ((string *)&local_318,(java *)local_2d8,(FieldDescriptor *)0x1,SUB81(local_2d0,0),
               (ClassNameResolver *)name_resolver,pOVar19);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[20]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [20])"value_default_value");
    std::__cxx11::string::operator=((string *)local_290->digits_,(string *)&local_318);
    if (local_318.slot_ != (slot_type *)local_308) {
      operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
    }
    if (local_148.heap.control != (ctrl_t *)local_138) {
      operator_delete(local_148.heap.control,local_138[0] + 1);
    }
    pfVar17 = local_168[0];
    if (local_168[0] ==
        (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_158) goto LAB_00321f71;
  }
LAB_00321f69:
  operator_delete(pfVar17,local_158._0_8_ + 1);
LAB_00321f71:
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[15]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_248,variables,(char (*) [15])"boxed_key_type");
  local_290 = *(AlphaNum **)(local_240._0_8_ + 0x10);
  local_298 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_240._0_8_ + 0x18);
  local_248 = (undefined1  [8])0x2;
  local_240._0_8_ = ", ";
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_210,variables,(char (*) [17])"boxed_value_type");
  local_2c8._8_8_ = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_208._0_8_ + 0x10);
  local_2c8._0_8_ = *(size_type *)(local_208._0_8_ + 0x18);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_268,(lts_20250127 *)&local_298,(AlphaNum *)local_248,
             (AlphaNum *)local_2c8,(AlphaNum *)name_resolver);
  local_318 = (anon_union_8_1_a8a14541_for_iterator_2)0xf;
  local_310.slot_ = (slot_type *)0x6346ce;
  pAVar1 = (AlphaNum *)(local_268 + 0x10);
  if ((AlphaNum *)local_268._0_8_ == pAVar1) {
    local_2f8._8_8_ = local_268._24_8_;
    local_308._0_8_ = (AlphaNum *)local_2f8;
  }
  else {
    local_308._0_8_ = local_268._0_8_;
  }
  local_2f8._1_7_ = local_268._17_7_;
  local_2f8[0] = local_268[0x10];
  local_308._8_8_ = local_268._8_8_;
  local_268._8_8_ = (slot_type *)0x0;
  local_268[0x10] = false;
  local_268._0_8_ = pAVar1;
  local_1e8._0_8_ = &local_318;
  local_1e8._8_8_ = (basic_string_view<char,_std::char_traits<char>_> *)local_308;
  local_188.first.ctrl_ = (ctrl_t *)variables;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_210,&local_188,(basic_string_view<char,_std::char_traits<char>_> *)&local_318
             ,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_1e8,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)(local_1e8 + 8));
  if ((AlphaNum *)local_308._0_8_ != (AlphaNum *)local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  if ((AlphaNum *)local_268._0_8_ != pAVar1) {
    operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
  }
  if (local_214 == JAVATYPE_MESSAGE) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[17]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [17])"boxed_value_type");
    local_310 = (anon_union_8_1_a8a14541_for_iterator_2)
                *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_290 + 0x10);
    local_318 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_290 + 0x18);
    local_298 = (anon_union_8_1_a8a14541_for_iterator_2)0x9;
    local_290 = (AlphaNum *)0x5de96e;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_248,(lts_20250127 *)&local_318,(AlphaNum *)&local_298,
               (AlphaNum *)local_310.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[21]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_2c8,variables,(char (*) [21])"value_interface_type");
    std::__cxx11::string::operator=((string *)(local_2c8._8_8_ + 0x10),(string *)local_248);
    if (local_248 != (undefined1  [8])(local_240 + 8)) {
      operator_delete((void *)local_248,(ulong)(local_240._8_8_ + 1));
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[17]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_298,variables,(char (*) [17])"boxed_value_type");
    local_310 = (anon_union_8_1_a8a14541_for_iterator_2)
                *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_290 + 0x10);
    local_318 = *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_290 + 0x18);
    local_298.slot_ = (slot_type *)&DAT_00000008;
    local_290 = (AlphaNum *)0x5f5628;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_248,(lts_20250127 *)&local_318,(AlphaNum *)&local_298,
               (AlphaNum *)local_310.slot_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_2c8,variables,(char (*) [19])"value_builder_type");
    std::__cxx11::string::operator=((string *)(local_2c8._8_8_ + 0x10),(string *)local_248);
    if (local_248 != (undefined1  [8])(local_240 + 8)) {
      operator_delete((void *)local_248,(ulong)(local_240._8_8_ + 1));
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[15]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_248,variables,(char (*) [15])"boxed_key_type");
    local_310 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_240._0_8_ + 0x10);
    local_318 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_240._0_8_ + 0x18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[21]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_248,variables,(char (*) [21])"value_interface_type");
    local_308._8_8_ = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_240._0_8_ + 0x10);
    local_308._0_8_ = *(undefined8 *)(local_240._0_8_ + 0x18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[17]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_248,variables,(char (*) [17])"boxed_value_type");
    local_2f8._8_8_ = *(size_type *)(local_240._0_8_ + 0x10);
    local_2f8._0_8_ = *(long *)(local_240._0_8_ + 0x18);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[19]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_248,variables,(char (*) [19])"value_builder_type");
    local_2f8._24_8_ = *(MaybeInitializedPtr *)(local_240._0_8_ + 0x10);
    local_2f8._16_8_ = *(undefined8 *)(local_240._0_8_ + 0x18);
    absl::lts_20250127::strings_internal::
    JoinAlgorithm<std::basic_string_view<char,std::char_traits<char>>const*,void>
              (&local_298,(strings_internal *)&local_318,local_2f8 + 0x20,2,", ");
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[24]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_248,variables,(char (*) [24])"builder_type_parameters");
    std::__cxx11::string::operator=((string *)(local_240._0_8_ + 0x10),(string *)&local_298);
    if (local_298.slot_ != (slot_type *)local_288) {
      operator_delete(local_298.slot_,local_288._0_8_ + 1);
    }
  }
  bVar4 = (this->descriptor_->options_->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_318,variables,(char (*) [12])0x64d889);
  pcVar16 = "";
  if (bVar4 != false) {
    pcVar16 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_310.slot_ + 0x10),0,*(char **)((long)local_310.slot_ + 0x18),
             (ulong)pcVar16);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_318,variables,(char (*) [11])"on_changed");
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_310.slot_ + 0x10),0,*(char **)((long)local_310.slot_ + 0x18),
             0x6346de);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_248,variables,(char (*) [17])0x5e544e);
  local_290 = *(AlphaNum **)(local_240._0_8_ + 0x10);
  local_298 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_240._0_8_ + 0x18);
  local_248 = (undefined1  [8])0x1f;
  local_240._0_8_ = "DefaultEntryHolder.defaultEntry";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_2c8,(lts_20250127 *)&local_298,(AlphaNum *)local_248,local_290);
  local_318.slot_ = (slot_type *)&DAT_0000000d;
  local_310.slot_ = (slot_type *)0x6346f6;
  pAVar1 = (AlphaNum *)(local_2c8 + 0x10);
  if ((AlphaNum *)local_2c8._0_8_ == pAVar1) {
    local_2f8._8_8_ = local_2b8._8_8_;
    local_308._0_8_ = (AlphaNum *)local_2f8;
  }
  else {
    local_308._0_8_ = local_2c8._0_8_;
  }
  local_2f8._1_7_ = local_2b8._1_7_;
  local_2f8[0] = local_2b8[0];
  local_308._8_8_ = local_2c8._8_8_;
  local_2c8._8_8_ = (slot_type *)0x0;
  local_2b8[0] = '\0';
  local_208._0_8_ = local_308;
  local_2c8._0_8_ = pAVar1;
  local_210.slot_ = (slot_type *)&local_318;
  local_1e8._0_8_ = variables;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_268,local_1e8,(basic_string_view<char,_std::char_traits<char>_> *)&local_318,
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_210,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)local_208);
  if ((AlphaNum *)local_308._0_8_ != (AlphaNum *)local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  if ((AlphaNum *)local_2c8._0_8_ != pAVar1) {
    operator_delete((void *)local_2c8._0_8_,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [14])"default_entry");
  local_318.slot_ = (slot_type *)&DAT_00000013;
  local_310.slot_ = (slot_type *)0x634724;
  local_308._0_8_ = (AlphaNum *)local_2f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_308,*(long *)local_290->digits_,
             *(long *)(local_290->digits_ + 8) + *(long *)local_290->digits_);
  d = (AlphaNum *)local_240;
  local_2c8._0_8_ = variables;
  local_248 = (undefined1  [8])&local_318;
  local_240._0_8_ = (slot_type *)local_308;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,local_2c8,(basic_string_view<char,_std::char_traits<char>_> *)&local_318,
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)local_248,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)d);
  if ((AlphaNum *)local_308._0_8_ != (AlphaNum *)local_2f8) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_2f8._0_8_ + 1));
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_210,local_2d0,this->descriptor_->file_,true);
  local_318 = (anon_union_8_1_a8a14541_for_iterator_2)local_208._0_8_;
  local_310 = local_210;
  local_298 = (anon_union_8_1_a8a14541_for_iterator_2)0xa;
  local_290 = (AlphaNum *)0x634738;
  pDVar7 = FieldDescriptor::message_type(this->descriptor_);
  UniqueFileScopeIdentifier_abi_cxx11_((string *)local_1e8,(java *)pDVar7,descriptor);
  local_248 = (undefined1  [8])local_1e8._8_8_;
  local_240._0_8_ = local_1e8._0_8_;
  local_2c8._0_8_ = &DAT_0000000d;
  local_2c8._8_8_ = "_descriptor, ";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_268,(lts_20250127 *)&local_318,(AlphaNum *)&local_298,
             (AlphaNum *)local_248,(AlphaNum *)local_2c8,d);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>(&local_188,variables,(char (*) [11])0x6f0796);
  std::__cxx11::string::operator=
            ((string *)((long)local_188.first.field_1.slot_ + 0x10),(string *)local_268);
  iVar14 = extraout_EDX;
  if ((AlphaNum *)local_268._0_8_ != (AlphaNum *)(local_268 + 0x10)) {
    operator_delete((void *)local_268._0_8_,CONCAT71(local_268._17_7_,local_268[0x10]) + 1);
    iVar14 = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
    iVar14 = extraout_EDX_01;
  }
  if (local_210.slot_ != (slot_type *)(local_208 + 8)) {
    operator_delete(local_210.slot_,local_208._8_8_ + 1);
    iVar14 = extraout_EDX_02;
  }
  GenerateGetBit_abi_cxx11_
            ((string *)&local_318,(java *)(ulong)(uint)this->builder_bit_index_,iVar14);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [26])"get_has_field_bit_builder");
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  iVar14 = extraout_EDX_03;
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
    iVar14 = extraout_EDX_04;
  }
  GenerateGetBitFromLocal_abi_cxx11_
            ((string *)&local_318,(java *)(ulong)(uint)this->builder_bit_index_,iVar14);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[29]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_298,variables,(char (*) [29])"get_has_field_bit_from_local");
  std::__cxx11::string::operator=((string *)((long)local_290 + 0x10),(string *)&local_318);
  iVar14 = extraout_EDX_05;
  if (local_318.slot_ != (slot_type *)local_308) {
    operator_delete(local_318.slot_,(ulong)(local_308._0_8_ + 1));
    iVar14 = extraout_EDX_06;
  }
  GenerateSetBit_abi_cxx11_
            ((string *)local_2c8,(java *)(ulong)(uint)this->builder_bit_index_,iVar14);
  local_318.slot_ = (slot_type *)local_2c8._8_8_;
  local_310.slot_ = (slot_type *)local_2c8._0_8_;
  local_298 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
  local_290 = (AlphaNum *)0x5599d2;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_248,(lts_20250127 *)&local_318,(AlphaNum *)&local_298,
             (AlphaNum *)local_2c8._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[26]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_268,variables,(char (*) [26])"set_has_field_bit_builder");
  std::__cxx11::string::operator=((string *)(local_268._8_8_ + 0x10),(string *)local_248);
  iVar14 = extraout_EDX_07;
  if (local_248 != (undefined1  [8])(local_240 + 8)) {
    operator_delete((void *)local_248,(ulong)(local_240._8_8_ + 1));
    iVar14 = extraout_EDX_08;
  }
  if ((AlphaNum *)local_2c8._0_8_ != pAVar1) {
    operator_delete((void *)local_2c8._0_8_,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
    iVar14 = extraout_EDX_09;
  }
  GenerateClearBit_abi_cxx11_
            ((string *)local_2c8,(java *)(ulong)(uint)this->builder_bit_index_,iVar14);
  local_318.slot_ = (slot_type *)local_2c8._8_8_;
  local_310.slot_ = (slot_type *)local_2c8._0_8_;
  local_298 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
  local_290 = (AlphaNum *)0x5599d2;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_248,(lts_20250127 *)&local_318,(AlphaNum *)&local_298,
             (AlphaNum *)local_2c8._8_8_);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[28]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_268,variables,(char (*) [28])"clear_has_field_bit_builder");
  std::__cxx11::string::operator=((string *)(local_268._8_8_ + 0x10),(string *)local_248);
  if (local_248 != (undefined1  [8])(local_240 + 8)) {
    operator_delete((void *)local_248,(ulong)(local_240._8_8_ + 1));
  }
  if ((AlphaNum *)local_2c8._0_8_ != pAVar1) {
    operator_delete((void *)local_2c8._0_8_,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((AlphaNum *)local_1c8._M_allocated_capacity != (AlphaNum *)local_1b8) {
    operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._0_8_ + 1);
  }
  return;
}

Assistant:

void ImmutableMapFieldGenerator::SetMessageVariables(
    const FieldGeneratorInfo* info) {
  SetCommonFieldVariables(descriptor_, info, &variables_);
  ClassNameResolver* name_resolver = context_->GetNameResolver();

  variables_["type"] =
      name_resolver->GetImmutableClassName(descriptor_->message_type());
  const FieldDescriptor* key = MapKeyField(descriptor_);
  const FieldDescriptor* value = MapValueField(descriptor_);
  const JavaType keyJavaType = GetJavaType(key);
  const JavaType valueJavaType = GetJavaType(value);

  // The code that generates the open-source version appears not to understand
  // #else, so we have an #ifndef instead.
  std::string pass_through_nullness =
      context_->options().opensource_runtime
          ? "/* nullable */\n"
          : "@com.google.protobuf.Internal.ProtoPassThroughNullness ";

  variables_["key_type"] = TypeName(key, name_resolver, false);
  std::string boxed_key_type = TypeName(key, name_resolver, true);
  variables_["boxed_key_type"] = boxed_key_type;
  // Used for calling the serialization function.
  variables_["short_key_type"] =
      boxed_key_type.substr(boxed_key_type.rfind('.') + 1);
  variables_["key_wire_type"] = WireType(key);
  variables_["key_default_value"] =
      DefaultValue(key, true, name_resolver, context_->options());
  variables_["key_null_check"] =
      IsReferenceType(keyJavaType)
          ? "if (key == null) { throw new NullPointerException(\"map key\"); }"
          : "";
  variables_["value_null_check"] =
      valueJavaType != JAVATYPE_ENUM && IsReferenceType(valueJavaType)
          ? "if (value == null) { "
            "throw new NullPointerException(\"map value\"); }"
          : "";
  if (valueJavaType == JAVATYPE_ENUM) {
    // We store enums as Integers internally.
    variables_["value_type"] = "int";
    variables_.insert(
        {"value_type_pass_through_nullness", variables_["value_type"]});
    variables_["boxed_value_type"] = "java.lang.Integer";
    variables_["value_wire_type"] = WireType(value);
    variables_["value_default_value"] =
        DefaultValue(value, true, name_resolver, context_->options()) +
        ".getNumber()";

    variables_["value_enum_type"] = TypeName(value, name_resolver, false);

    variables_.insert(
        {"value_enum_type_pass_through_nullness",
         absl::StrCat(pass_through_nullness, variables_["value_enum_type"])});

    if (SupportUnknownEnumValue(value)) {
      // Map unknown values to a special UNRECOGNIZED value if supported.
      variables_.insert(
          {"unrecognized_value",
           absl::StrCat(variables_["value_enum_type"], ".UNRECOGNIZED")});
    } else {
      // Map unknown values to the default value if we don't have UNRECOGNIZED.
      variables_["unrecognized_value"] =
          DefaultValue(value, true, name_resolver, context_->options());
    }
  } else {
    variables_["value_type"] = TypeName(value, name_resolver, false);

    variables_.insert(
        {"value_type_pass_through_nullness",
         absl::StrCat(
             (IsReferenceType(valueJavaType) ? pass_through_nullness : ""),
             variables_["value_type"])});

    variables_["boxed_value_type"] = TypeName(value, name_resolver, true);
    variables_["value_wire_type"] = WireType(value);
    variables_["value_default_value"] =
        DefaultValue(value, true, name_resolver, context_->options());
  }

  variables_.insert(
      {"type_parameters", absl::StrCat(variables_["boxed_key_type"], ", ",
                                       variables_["boxed_value_type"])});

  if (valueJavaType == JAVATYPE_MESSAGE) {
    variables_["value_interface_type"] =
        absl::StrCat(variables_["boxed_value_type"], "OrBuilder");
    variables_["value_builder_type"] =
        absl::StrCat(variables_["boxed_value_type"], ".Builder");
    variables_["builder_type_parameters"] = absl::StrJoin(
        {variables_["boxed_key_type"], variables_["value_interface_type"],
         variables_["boxed_value_type"], variables_["value_builder_type"]},
        ", ");
  }
  // TODO: Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  variables_["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";
  variables_["on_changed"] = "onChanged();";

  variables_.insert(
      {"default_entry", absl::StrCat(variables_["capitalized_name"],
                                     "DefaultEntryHolder.defaultEntry")});
  variables_.insert({"map_field_parameter", variables_["default_entry"]});
  variables_["descriptor"] = absl::StrCat(
      name_resolver->GetImmutableClassName(descriptor_->file()), ".internal_",
      UniqueFileScopeIdentifier(descriptor_->message_type()), "_descriptor, ");
  variables_["get_has_field_bit_builder"] = GenerateGetBit(builder_bit_index_);
  variables_["get_has_field_bit_from_local"] =
      GenerateGetBitFromLocal(builder_bit_index_);
  variables_["set_has_field_bit_builder"] =
      absl::StrCat(GenerateSetBit(builder_bit_index_), ";");
  variables_["clear_has_field_bit_builder"] =
      absl::StrCat(GenerateClearBit(builder_bit_index_), ";");
}